

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rlib::string::
format<char,int_const&,std::__cxx11::string,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *this,char *lpszFormat,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *args_2)

{
  long *plVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  allocator<char> local_131;
  string_type local_130;
  undefined1 local_110 [128];
  void *local_90;
  undefined8 uStack_88;
  long local_80 [4];
  locale local_60 [8];
  char *local_58;
  bool local_50;
  bool local_40;
  locale local_38 [8];
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             (char *)0x0);
  local_110[0x70] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,(char *)this,&local_131);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             &local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  inner::
  f<char,int_const,std::__cxx11::string&,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             (int *)lpszFormat,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)args_1);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (__return_storage_ptr__,local_110);
  if (local_40 == true) {
    std::locale::~locale(local_38);
    local_40 = false;
  }
  local_110._120_8_ = &PTR__basic_altstringbuf_00177cc8;
  if (local_50 == true) {
    plVar1 = local_80 + 3;
    if (local_80[2] == 0) {
      plVar1 = local_80;
    }
    operator_delete(local_90,*plVar1 - (long)local_90);
  }
  local_50 = false;
  local_58 = (char *)0x0;
  local_90 = (void *)0x0;
  uStack_88 = 0;
  local_80[0] = 0;
  local_80[1] = 0;
  local_80[2] = 0;
  local_80[3] = 0;
  local_110._120_8_ = boost::program_options::detail::cmdline::cmdline;
  std::locale::~locale(local_60);
  if ((undefined1 *)local_110._80_8_ != local_110 + 0x60) {
    operator_delete((void *)local_110._80_8_,local_110._96_8_ + 1);
  }
  if ((_Bit_type *)local_110._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_110._24_8_,local_110._56_8_ - local_110._24_8_);
    local_110._24_8_ = (_Bit_type *)0x0;
    local_110._32_4_ = 0;
    local_110._40_8_ = (_Bit_type *)0x0;
    local_110._48_4_ = 0;
    local_110._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}